

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int tx_elements_output_init
              (uint64_t satoshi,uchar *script,size_t script_len,uchar *asset,size_t asset_len,
              uchar *value,size_t value_len,uchar *nonce,size_t nonce_len,uchar *surjectionproof,
              size_t surjectionproof_len,uchar *rangeproof,size_t rangeproof_len,
              wally_tx_output *output,_Bool is_elements)

{
  _Bool _Var1;
  uchar *local_70;
  uchar *new_script;
  int local_60;
  int old_features;
  int ret;
  _Bool is_elements_local;
  uchar *value_local;
  size_t asset_len_local;
  uchar *asset_local;
  size_t script_len_local;
  uchar *script_local;
  uint64_t satoshi_local;
  
  old_features._3_1_ = is_elements;
  local_70 = (uchar *)0x0;
  if ((((script != (uchar *)0x0) == (script_len != 0)) && (output != (wally_tx_output *)0x0)) &&
     ((satoshi < 0x775f05a074001 || (is_elements)))) {
    _ret = value;
    value_local = (uchar *)asset_len;
    asset_len_local = (size_t)asset;
    asset_local = (uchar *)script_len;
    script_len_local = (size_t)script;
    script_local = (uchar *)satoshi;
    _Var1 = clone_bytes(&local_70,script,script_len);
    if (_Var1) {
      new_script._4_4_ = (uint)output->features;
      output->features = '\0';
      local_60 = tx_elements_output_commitment_init
                           (output,(uchar *)asset_len_local,(size_t)value_local,_ret,value_len,nonce
                            ,nonce_len,surjectionproof,surjectionproof_len,rangeproof,rangeproof_len
                            ,(_Bool)(old_features._3_1_ & 1));
      if (local_60 == 0) {
        output->script = local_70;
        output->script_len = (size_t)asset_local;
        output->satoshi = (uint64_t)script_local;
        satoshi_local._4_4_ = 0;
      }
      else {
        output->features = (uint8_t)new_script._4_4_;
        clear_and_free(local_70,(size_t)asset_local);
        satoshi_local._4_4_ = local_60;
      }
    }
    else {
      satoshi_local._4_4_ = -3;
    }
  }
  else {
    satoshi_local._4_4_ = -2;
  }
  return satoshi_local._4_4_;
}

Assistant:

static int tx_elements_output_init(
    uint64_t satoshi,
    const unsigned char *script,
    size_t script_len,
    const unsigned char *asset,
    size_t asset_len,
    const unsigned char *value,
    size_t value_len,
    const unsigned char *nonce,
    size_t nonce_len,
    const unsigned char *surjectionproof,
    size_t surjectionproof_len,
    const unsigned char *rangeproof,
    size_t rangeproof_len,
    struct wally_tx_output *output,
    bool is_elements)
{
    int ret, old_features;
    unsigned char *new_script = NULL;

    if (BYTES_INVALID(script, script_len) || !output ||
        (satoshi > WALLY_SATOSHI_MAX && !is_elements))
        return WALLY_EINVAL;

    if (!clone_bytes(&new_script, script, script_len))
        return WALLY_ENOMEM;

    old_features = output->features;
    output->features = 0;
    if ((ret = tx_elements_output_commitment_init(output, asset, asset_len,
                                                  value, value_len,
                                                  nonce, nonce_len,
                                                  surjectionproof, surjectionproof_len,
                                                  rangeproof, rangeproof_len,
                                                  is_elements)) != WALLY_OK) {
        output->features = old_features;
        clear_and_free(new_script, script_len);
        return ret;
    }

    output->script = new_script;
    output->script_len = script_len;
    output->satoshi = satoshi;
    return WALLY_OK;
}